

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnector.cpp
# Opt level: O1

int __thiscall
FIX::SocketConnector::connect(SocketConnector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socket_handle s;
  undefined4 in_register_00000034;
  int in_R8D;
  int in_R9D;
  undefined8 *in_stack_00000008;
  int in_stack_00000010;
  
  s = socket_createConnector();
  if (s != -1) {
    if ((char)__len != '\0') {
      socket_setsockopt(s,1);
    }
    if (in_R8D != 0) {
      socket_setsockopt(s,7,in_R8D);
    }
    if (in_R9D != 0) {
      socket_setsockopt(s,8,in_R9D);
    }
    if ((in_stack_00000010 != 0) || (in_stack_00000008[1] != 0)) {
      socket_bind(s,(char *)*in_stack_00000008,in_stack_00000010);
    }
    SocketMonitor::addConnect(&this->m_monitor,s);
    socket_connect(s,*(char **)CONCAT44(in_register_00000034,__fd),(int)__addr);
  }
  return s;
}

Assistant:

socket_handle SocketConnector::connect(
    const std::string &address,
    int port,
    bool noDelay,
    int sendBufSize,
    int rcvBufSize,
    const std::string &sourceAddress,
    int sourcePort) {
  socket_handle socket = socket_createConnector();

  if (socket != INVALID_SOCKET_HANDLE) {
    if (noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, sendBufSize);
    }
    if (rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, rcvBufSize);
    }
    if (!sourceAddress.empty() || sourcePort) {
      socket_bind(socket, sourceAddress.c_str(), sourcePort);
    }
    m_monitor.addConnect(socket);
    socket_connect(socket, address.c_str(), port);
  }
  return socket;
}